

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  int iVar1;
  ushort uVar2;
  bool bVar3;
  int local_54;
  int local_40;
  ushort local_3a;
  int nAlloc;
  int iStack_34;
  u16 flags;
  int iLimit;
  int nByte;
  _func_void_void_ptr *xDel_local;
  u8 enc_local;
  int n_local;
  char *z_local;
  Mem *pMem_local;
  
  if (z == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    return 0;
  }
  if (pMem->db == (sqlite3 *)0x0) {
    nAlloc = 1000000000;
  }
  else {
    nAlloc = pMem->db->aLimit[0];
  }
  local_3a = 2;
  if (enc == '\0') {
    local_3a = 0x10;
  }
  iStack_34 = n;
  if (n < 0) {
    if (enc == '\x01') {
      iStack_34 = sqlite3Strlen30(z);
      if (nAlloc < iStack_34) {
        iStack_34 = nAlloc + 1;
      }
    }
    else {
      iStack_34 = 0;
      while( true ) {
        bVar3 = false;
        if (iStack_34 <= nAlloc) {
          bVar3 = z[iStack_34] != '\0' || z[iStack_34 + 1] != '\0';
        }
        if (!bVar3) break;
        iStack_34 = iStack_34 + 2;
      }
    }
    local_3a = local_3a | 0x200;
  }
  if (xDel == (_func_void_void_ptr *)0xffffffffffffffff) {
    local_40 = iStack_34;
    if ((local_3a & 0x200) != 0) {
      local_40 = 2;
      if (enc == '\x01') {
        local_40 = 1;
      }
      local_40 = local_40 + iStack_34;
    }
    if (nAlloc < iStack_34) {
      return 0x12;
    }
    if (local_40 < 0x21) {
      local_54 = 0x20;
    }
    else {
      local_54 = local_40;
    }
    iVar1 = sqlite3VdbeMemClearAndResize(pMem,local_54);
    if (iVar1 != 0) {
      return 7;
    }
    memcpy(pMem->z,z,(long)local_40);
  }
  else if (xDel == sqlite3MallocSize) {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = z;
    pMem->zMalloc = z;
    iVar1 = sqlite3DbMallocSize(pMem->db,pMem->zMalloc);
    pMem->szMalloc = iVar1;
  }
  else {
    sqlite3VdbeMemRelease(pMem);
    pMem->z = z;
    pMem->xDel = xDel;
    uVar2 = 0x400;
    if (xDel == (_func_void_void_ptr *)0x0) {
      uVar2 = 0x800;
    }
    local_3a = local_3a | uVar2;
  }
  pMem->n = iStack_34;
  pMem->flags = local_3a;
  if (enc == '\0') {
    enc = '\x01';
  }
  pMem->enc = enc;
  if ((pMem->enc == '\x01') || (iVar1 = sqlite3VdbeMemHandleBom(pMem), iVar1 == 0)) {
    if (nAlloc < iStack_34) {
      pMem_local._4_4_ = 0x12;
    }
    else {
      pMem_local._4_4_ = 0;
    }
  }
  else {
    pMem_local._4_4_ = 7;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( (pMem->flags & MEM_RowSet)==0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = sqlite3Strlen30(z);
      if( nByte>iLimit ) nByte = iLimit+1;
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    int nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return SQLITE_TOOBIG;
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else if( xDel==SQLITE_DYNAMIC ){
    sqlite3VdbeMemRelease(pMem);
    pMem->zMalloc = pMem->z = (char *)z;
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    pMem->xDel = xDel;
    flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}